

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::logTestPlan
          (ImageSampleRenderInstance *this)

{
  ostream *poVar1;
  char *pcVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_380;
  char *local_378;
  char *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  MessageBuilder local_330;
  int local_1ac;
  undefined1 local_1a8 [4];
  int srcResourceNdx;
  ChannelType local_198;
  int resultNdx;
  ostringstream msg;
  ImageSampleRenderInstance *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  std::operator<<((ostream *)&stack0xfffffffffffffe78,"Rendering 2x2 grid.\n");
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,
                             "Single descriptor set. Descriptor set contains ");
    if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      local_370 = "single";
    }
    else {
      if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
        local_378 = "two";
      }
      else {
        if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) {
          local_380 = "two";
        }
        else {
          local_380 = (char *)0x0;
          if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
            local_380 = "an array (size 2) of";
          }
        }
        local_378 = local_380;
      }
      local_370 = local_378;
    }
    poVar1 = std::operator<<(poVar1,local_370);
    std::operator<<(poVar1," VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n");
  }
  else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,
                             "Single descriptor set. Descriptor set contains ");
    if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      local_398 = "single";
    }
    else {
      if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
        local_3a0 = "two";
      }
      else {
        if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) {
          local_3a8 = "two";
        }
        else {
          local_3a8 = (char *)0x0;
          if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
            local_3a8 = "an array (size 2) of";
          }
        }
        local_3a0 = local_3a8;
      }
      local_398 = local_3a0;
    }
    poVar1 = std::operator<<(poVar1,local_398);
    std::operator<<(poVar1," VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n");
  }
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Image view type is ");
  pcVar2 = ::vk::getImageViewTypeName(this->m_viewType);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  if (this->m_baseMipLevel != 0) {
    poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Image view base mip level = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_baseMipLevel);
    std::operator<<(poVar1,"\n");
  }
  if (this->m_baseArraySlice != 0) {
    poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Image view base array slice = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_baseArraySlice);
    std::operator<<(poVar1,"\n");
  }
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,"Sampler mode is LINEAR, with WRAP\n");
  }
  else {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,
                    "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n");
  }
  if (this->m_stageFlags == 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,
                    "Descriptors are not accessed in any shader stage.\n");
  }
  else {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,
                    "Color in each cell is fetched using the descriptor(s):\n");
    for (local_198 = SNORM_INT8; (int)local_198 < 4; local_198 = local_198 + SNORM_INT16) {
      poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Test sample ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_198);
      poVar1 = std::operator<<(poVar1,": sample at position ");
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)local_1a8,this->m_viewType,this->m_baseMipLevel,
                 this->m_baseArraySlice,local_198);
      tcu::operator<<(poVar1,(Vector<float,_4> *)local_1a8);
      if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
        local_1ac = (int)local_198 % 2;
        if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
          poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78," using sampler ");
          std::ostream::operator<<(poVar1,local_1ac);
        }
        else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
          poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,
                                   " from combined image sampler ");
          std::ostream::operator<<(poVar1,local_1ac);
        }
      }
      std::operator<<((ostream *)&stack0xfffffffffffffe78,"\n");
    }
    poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Descriptors are accessed in {");
    pcVar2 = "";
    if ((this->m_stageFlags & 1) != 0) {
      pcVar2 = " vertex";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    pcVar2 = "";
    if ((this->m_stageFlags & 2) != 0) {
      pcVar2 = " tess_control";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    pcVar2 = "";
    if ((this->m_stageFlags & 4) != 0) {
      pcVar2 = " tess_evaluation";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    pcVar2 = "";
    if ((this->m_stageFlags & 8) != 0) {
      pcVar2 = " geometry";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    pcVar2 = "";
    if ((this->m_stageFlags & 0x10) != 0) {
      pcVar2 = " fragment";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1," } stages.");
  }
  this_00 = Context::getTestContext
                      ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.
                       super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_330,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this_02 = tcu::MessageBuilder::operator<<(&local_330,&local_350);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_350);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  return;
}

Assistant:

void ImageSampleRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 grid.\n";

	if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
	}
	else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
	}
	else
		DE_FATAL("Impossible");

	msg << "Image view type is " << vk::getImageViewTypeName(m_viewType) << "\n";

	if (m_baseMipLevel)
		msg << "Image view base mip level = " << m_baseMipLevel << "\n";
	if (m_baseArraySlice)
		msg << "Image view base array slice = " << m_baseArraySlice << "\n";

	if (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)
		msg << "Sampler mode is LINEAR, with WRAP\n";
	else
		msg << "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Color in each cell is fetched using the descriptor(s):\n";

		for (int resultNdx = 0; resultNdx < 4; ++resultNdx)
		{
			msg << "Test sample " << resultNdx << ": sample at position " << m_images.getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, resultNdx);

			if (m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR)
			{
				const int srcResourceNdx = (resultNdx % 2); // ABAB source

				if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
					msg << " using sampler " << srcResourceNdx;
				else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
					msg << " from combined image sampler " << srcResourceNdx;
				else
					DE_FATAL("Impossible");
			}
			msg << "\n";
		}

		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}